

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::storeObject
               (NameIdPool<xercesc_4_0::DTDElementDecl> *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *pMVar2;
  XMLSize_t XVar3;
  DTDElementDecl *pDVar4;
  DTDElementDecl *data;
  undefined1 local_38 [8];
  NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl> e;
  XSerializeEngine *serEng_local;
  NameIdPool<xercesc_4_0::DTDElementDecl> *objToStore_local;
  
  e.fMemoryManager = (MemoryManager *)serEng;
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    pMVar2 = NameIdPool<xercesc_4_0::DTDElementDecl>::getMemoryManager(objToStore);
    NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl>::NameIdPoolEnumerator
              ((NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl> *)local_38,objToStore,pMVar2);
    pMVar2 = e.fMemoryManager;
    XVar3 = NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl>::size
                      ((NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl> *)local_38);
    XSerializeEngine::operator<<((XSerializeEngine *)pMVar2,(uint)XVar3);
    while (bVar1 = NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl>::hasMoreElements
                             ((NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl> *)local_38), bVar1)
    {
      pDVar4 = NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl>::nextElement
                         ((NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl> *)local_38);
      (*(pDVar4->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[3])
                (pDVar4,e.fMemoryManager);
    }
    NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl>::~NameIdPoolEnumerator
              ((NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl> *)local_38);
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(NameIdPool<DTDElementDecl>* const objToStore
                                    , XSerializeEngine&                 serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        NameIdPoolEnumerator<DTDElementDecl> e(objToStore, objToStore->getMemoryManager());

        serEng<<(unsigned int)e.size();

        while (e.hasMoreElements())
        {
            DTDElementDecl& data = e.nextElement();
            data.serialize(serEng);
        }
    }

}